

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CPalSynchronizationManager::CPalSynchronizationManager(CPalSynchronizationManager *this)

{
  CPalSynchronizationManager *this_local;
  
  IPalSynchronizationManager::IPalSynchronizationManager(&this->super_IPalSynchronizationManager);
  (this->super_IPalSynchronizationManager)._vptr_IPalSynchronizationManager =
       (_func_int **)&PTR_BlockThread_01dc41e8;
  this->m_dwWorkerThreadTid = 0;
  this->m_pipoThread = (IPalObject *)0x0;
  this->m_pthrWorker = (CPalThread *)0x0;
  this->m_iProcessPipeRead = -1;
  this->m_iProcessPipeWrite = -1;
  this->m_pmplnMonitoredProcesses = (MonitoredProcessesListNode *)0x0;
  this->m_lMonitoredProcessesCount = 0;
  this->m_pmplnExitedNodes = (MonitoredProcessesListNode *)0x0;
  CSynchCache<CorUnix::CSynchWaitController>::CSynchCache(&this->m_cacheWaitCtrlrs,0x100);
  CSynchCache<CorUnix::CSynchStateController>::CSynchCache(&this->m_cacheStateCtrlrs,0x100);
  CSynchCache<CorUnix::CSynchData>::CSynchCache(&this->m_cacheSynchData,0x100);
  CSHRSynchCache<CorUnix::CSynchData>::CSHRSynchCache(&this->m_cacheSHRSynchData,0x100);
  CSynchCache<CorUnix::_WaitingThreadsListNode>::CSynchCache(&this->m_cacheWTListNodes,0x100);
  CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::CSHRSynchCache
            (&this->m_cacheSHRWTListNodes,0x100);
  CSynchCache<CorUnix::_ThreadApcInfoNode>::CSynchCache(&this->m_cacheThreadApcInfoNodes,0x20);
  CSynchCache<CorUnix::_OwnedObjectsListNode>::CSynchCache(&this->m_cacheOwnedObjectsListNodes,0x10)
  ;
  return;
}

Assistant:

CPalSynchronizationManager::CPalSynchronizationManager()
        : m_dwWorkerThreadTid(0),
          m_pipoThread(NULL),
          m_pthrWorker(NULL),
          m_iProcessPipeRead(-1),
          m_iProcessPipeWrite(-1),
          m_pmplnMonitoredProcesses(NULL),
          m_lMonitoredProcessesCount(0),
          m_pmplnExitedNodes(NULL),
          m_cacheWaitCtrlrs(CtrlrsCacheMaxSize),
          m_cacheStateCtrlrs(CtrlrsCacheMaxSize),
          m_cacheSynchData(SynchDataCacheMaxSize),
          m_cacheSHRSynchData(SynchDataCacheMaxSize),
          m_cacheWTListNodes(WTListNodeCacheMaxSize),
          m_cacheSHRWTListNodes(WTListNodeCacheMaxSize),
          m_cacheThreadApcInfoNodes(ApcInfoNodeCacheMaxSize),
          m_cacheOwnedObjectsListNodes(OwnedObjectsListCacheMaxSize)
    {
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        m_iKQueue = -1;
        // Initialize data to 0 and flags to EV_EOF
        EV_SET(&m_keProcessPipeEvent, 0, 0, EV_EOF, 0, 0, 0);
#endif // HAVE_KQUEUE
    }